

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_inline.cpp
# Opt level: O2

BBLIter __thiscall
mocker::FunctionInline::inlineFunction
          (FunctionInline *this,FunctionModule *caller,BBLIter bbIter,InstListIter callInstIter)

{
  _List_node_base **pp_Var1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  pointer psVar6;
  bool bVar7;
  mapped_type *pmVar8;
  BBLIter BVar9;
  mapped_type *pmVar10;
  _List_node_base *p_Var11;
  mapped_type *pmVar12;
  size_type __n;
  __shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  BasicBlock *pBVar14;
  __shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *this_00;
  FunctionInline *this_01;
  size_t in_R9;
  _List_node_base *p_Var15;
  shared_ptr<mocker::ir::Reg> newDest;
  shared_ptr<mocker::ir::Jump> jump;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  __shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2> local_248;
  _List_node_base *local_238;
  _List_node_base *local_230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  FunctionModule *local_220;
  BasicBlock *local_218;
  __node_base local_210;
  shared_ptr<mocker::ir::Call> call;
  shared_ptr<mocker::ir::Reg> retVal;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  newLabelID;
  shared_ptr<mocker::ir::IRInst> local_1a8;
  shared_ptr<mocker::ir::IRInst> local_198;
  _List_node_base *local_188;
  _List_node_base *local_180;
  BasicBlock *local_178;
  key_type local_170;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newIdent;
  shared_ptr<mocker::ir::IRInst> local_128;
  shared_ptr<mocker::ir::IRInst> local_118;
  mapped_type callee;
  
  ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&call,(shared_ptr<mocker::ir::IRInst> *)(callInstIter._M_node + 1));
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&((this->super_ModulePass).module)->funcs,
                &(call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 funcName);
  ir::FunctionModule::FunctionModule(&callee,pmVar8);
  if (callee.isExternal == true) {
    p_Var11 = (bbIter._M_node)->_M_next;
  }
  else {
    retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&newLabelID,"retVal",(allocator<char> *)&operands);
      ir::FunctionModule::makeTempLocalReg((FunctionModule *)&newIdent,&caller->identifier);
      std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&newIdent);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newIdent._M_h._M_bucket_count);
      std::__cxx11::string::~string((string *)&newLabelID);
      p_Var11 = (caller->bbs).
                super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)&newLabelID);
      local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)newLabelID._M_h._M_buckets;
      local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)newLabelID._M_h._M_bucket_count;
      newLabelID._M_h._M_buckets = (__buckets_ptr)0x0;
      newLabelID._M_h._M_bucket_count = 0;
      ir::BasicBlock::appendInstFront((BasicBlock *)(p_Var11 + 1),&local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newLabelID._M_h._M_bucket_count);
    }
    BVar9 = ir::FunctionModule::insertBBAfter(caller,bbIter);
    pp_Var1 = &BVar9._M_node[1]._M_prev;
    std::__cxx11::
    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::splice((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
              *)pp_Var1,(int)pp_Var1,(__off64_t *)&bbIter._M_node[1]._M_prev,
             (int)callInstIter._M_node,(__off64_t *)&bbIter._M_node[1]._M_prev,in_R9,
             (uint)newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::
    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::pop_front((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                 *)pp_Var1);
    if (((call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      std::
      make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)&newLabelID,
                 &((call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Definition).dest);
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
      ::emplace_front<std::shared_ptr<mocker::ir::Load>>
                ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                  *)pp_Var1,(shared_ptr<mocker::ir::Load> *)&newLabelID);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newLabelID._M_h._M_bucket_count);
    }
    local_218 = (BasicBlock *)(bbIter._M_node + 1);
    newLabelID._M_h._M_buckets = &newLabelID._M_h._M_single_bucket;
    newLabelID._M_h._M_bucket_count = 1;
    newLabelID._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    newLabelID._M_h._M_element_count = 0;
    newLabelID._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    newLabelID._M_h._M_rehash_policy._M_next_resize = 0;
    newLabelID._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_238 = BVar9._M_node;
    local_220 = caller;
    for (p_Var11 = (_List_node_base *)&callee.bbs;
        p_Var11 !=
        callee.bbs.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
        ._M_impl._M_node.super__List_node_base._M_next; p_Var11 = p_Var11->_M_prev) {
      p_Var15 = p_Var11->_M_prev;
      BVar9 = ir::FunctionModule::insertBBAfter(local_220,bbIter);
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
      ::operator=((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   *)&BVar9._M_node[1]._M_prev,
                  (list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   *)&p_Var15[1]._M_prev);
      p_Var2 = BVar9._M_node[1]._M_next;
      newIdent._M_h._M_buckets = (__buckets_ptr)p_Var15[1]._M_next;
      pmVar10 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&newLabelID,(key_type *)&newIdent);
      *pmVar10 = (mapped_type)p_Var2;
    }
    newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         callee.bbs.
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next[1]._M_next;
    std::__detail::
    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)&newLabelID,(key_type *)&newDest);
    std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&operands);
    std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
              ((shared_ptr<mocker::ir::Label> *)&newIdent);
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)newIdent._M_h._M_buckets;
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)newIdent._M_h._M_bucket_count;
    newIdent._M_h._M_buckets = (__buckets_ptr)0x0;
    newIdent._M_h._M_bucket_count = 0;
    ir::BasicBlock::appendInst(local_218,&local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newIdent._M_h._M_bucket_count);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &operands.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    newIdent._M_h._M_buckets = &newIdent._M_h._M_single_bucket;
    newIdent._M_h._M_bucket_count = 1;
    newIdent._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    newIdent._M_h._M_element_count = 0;
    newIdent._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    newIdent._M_h._M_rehash_policy._M_next_resize = 0;
    newIdent._M_h._M_single_bucket = (__node_base_ptr)0x0;
    p_Var11 = (bbIter._M_node)->_M_next;
    local_188 = p_Var11;
    while (p_Var11 != local_238) {
      local_178 = (BasicBlock *)&p_Var11[1]._M_prev;
      pBVar14 = local_178;
      local_180 = p_Var11;
      while (pBVar14 = (BasicBlock *)pBVar14->labelID, pBVar14 != local_178) {
        pp_Var1 = &(pBVar14->insts).
                   super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
        local_218 = pBVar14;
        ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&operands,(shared_ptr<mocker::ir::IRInst> *)pp_Var1);
        if (operands.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          __assert_fail("!ir::dyc<ir::Phi>(inst)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/function_inline.cpp"
                        ,0xa0,
                        "ir::BBLIter mocker::FunctionInline::inlineFunction(ir::FunctionModule &, ir::BBLIter, ir::InstListIter)"
                       );
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &operands.
                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        ir::getDest((shared_ptr<mocker::ir::IRInst> *)&jump);
        newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&operands);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (operands.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          ir::FunctionModule::makeTempLocalReg((FunctionModule *)&newDest,&local_220->identifier);
          ir::copyWithReplacedDest((ir *)&jump,(shared_ptr<mocker::ir::IRInst> *)pp_Var1,&newDest);
          std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)pp_Var1,
                     (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)&jump);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          pmVar12 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&newIdent,
                                 (key_type *)
                                 &((operands.
                                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_refcount);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &operands.
                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        ir::getOperandsUsed(&operands,(shared_ptr<mocker::ir::IRInst> *)pp_Var1);
        psVar6 = operands.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = &(operands.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
            this_00 != &psVar6->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
            this_00 = this_00 + 1) {
          this_01 = (FunctionInline *)&newDest;
          ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&newDest);
          if (newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar7 = isParameter(this_01,&callee,
                                &(newDest.
                                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->identifier);
            if (bVar7) {
              __n = std::__cxx11::stol(&(newDest.
                                         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->identifier,(size_t *)0x0,10);
              p_Var13 = &std::
                         vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ::at(&(call.
                                super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->args,__n)->
                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
              std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (this_00,p_Var13);
            }
            else {
              std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&newIdent,
                   &(newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->identifier);
              std::make_shared<mocker::ir::Reg,std::__cxx11::string&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&jump)
              ;
              std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)this_00,
                         (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&jump);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        ir::copyWithReplacedOperands
                  ((ir *)&newDest,(shared_ptr<mocker::ir::IRInst> *)pp_Var1,&operands);
        std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)pp_Var1,
                   (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)&newDest);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&newDest,(shared_ptr<mocker::ir::IRInst> *)pp_Var1);
        peVar5 = newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          ir::dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>&>
                    ((ir *)&jump,(shared_ptr<mocker::ir::IRInst> *)pp_Var1);
          if (jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            local_210._M_nxt =
                 (_Hash_node_base *)
                 (((jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  label).super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 id;
            std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&newLabelID,(key_type *)&local_210);
            std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_230);
            std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
                      ((shared_ptr<mocker::ir::Label> *)&local_248);
            std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)pp_Var1,
                       &local_248);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount)
            ;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228);
          }
          p_Var4 = &jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>;
        }
        else {
          local_210._M_nxt =
               (_Hash_node_base *)
               newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
               super_Addr._vptr_Addr[1];
          std::__detail::
          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&newLabelID,(key_type *)&local_210);
          std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_248);
          local_170 = *(key_type *)
                       (newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr[1].identifier._M_string_length + 8);
          std::__detail::
          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&newLabelID,&local_170);
          std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_230);
          std::
          make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
                    ((shared_ptr<mocker::ir::Addr> *)&jump,
                     (shared_ptr<mocker::ir::Label> *)&(peVar5->identifier).field_2,
                     (shared_ptr<mocker::ir::Label> *)&local_248);
          std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)pp_Var1,
                     (__shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2> *)&jump);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228);
          p_Var4 = &local_248;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var4->_M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ir::dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&newDest,(shared_ptr<mocker::ir::IRInst> *)pp_Var1);
        if (newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::__cxx11::
          list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          ::push_front((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                        *)&(local_220->bbs).
                           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                           ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,
                       (value_type *)pp_Var1);
          std::make_shared<mocker::ir::Deleted>();
          std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)pp_Var1,
                     (__shared_ptr<mocker::ir::Deleted,_(__gnu_cxx::_Lock_policy)2> *)&jump);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ::~vector(&operands);
        pBVar14 = local_218;
      }
      p_Var11 = local_180->_M_next;
    }
    p_Var11 = local_238;
    for (p_Var15 = local_188; p_Var15 != p_Var11; p_Var15 = p_Var15->_M_next) {
      ir::dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)&operands,(shared_ptr<mocker::ir::IRInst> *)(p_Var15[2]._M_next + 1));
      if (operands.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        std::__cxx11::
        list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
        ::pop_back((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    *)&p_Var15[1]._M_prev);
        if (((call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          p_Var3 = operands.
                   super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].
                   super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_230 = (_List_node_base *)((ulong)local_230 & 0xffffffff00000000);
            std::make_shared<mocker::ir::IntLiteral,int>((int *)&local_248);
            jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_248._M_ptr;
            jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = local_248._M_refcount._M_pi;
            local_248._M_ptr = (element_type *)0x0;
            local_248._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)&jump,
                       (__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                       &operands.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
          }
          std::
          make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>const>
                    (&newDest,(shared_ptr<mocker::ir::Addr> *)&retVal);
          local_198.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_198.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ir::BasicBlock::appendInst((BasicBlock *)(p_Var15 + 1),&local_198);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_198.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount)
            ;
          }
        }
        local_230 = local_238[1]._M_next;
        std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)&jump);
        std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
                  ((shared_ptr<mocker::ir::Label> *)&newDest);
        local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ir::BasicBlock::appendInst((BasicBlock *)(p_Var15 + 1),&local_1a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var11 = local_238;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &operands.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&newIdent._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&newLabelID._M_h);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  ir::FunctionModule::~FunctionModule(&callee);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (BBLIter)p_Var11;
}

Assistant:

ir::BBLIter FunctionInline::inlineFunction(ir::FunctionModule &caller,
                                           ir::BBLIter bbIter,
                                           ir::InstListIter callInstIter) {
  auto call = ir::dyc<ir::Call>(*callInstIter);
  // do not use a reference here
  auto callee = module.getFuncs().at(call->getFuncName());
  if (callee.isExternalFunc())
    return ++bbIter;

  // create a temporary variable to hold the return value
  std::shared_ptr<ir::Reg> retVal = nullptr;
  if (call->getDest()) {
    retVal = caller.makeTempLocalReg("retVal");
    caller.getFirstBB()->appendInstFront(std::make_shared<ir::Alloca>(retVal));
  }

  // move the subsequent instructions to a new BB
  auto succBBIter = caller.insertBBAfter(bbIter);
  succBBIter->getMutableInsts().splice(succBBIter->getMutableInsts().end(),
                                       bbIter->getMutableInsts(), callInstIter,
                                       bbIter->getMutableInsts().end());
  succBBIter->getMutableInsts().pop_front();
  if (call->getDest())
    succBBIter->getMutableInsts().emplace_front(
        std::make_shared<ir::Load>(call->getDest(), retVal));

  // insert new BBs
  std::unordered_map<std::size_t, std::size_t> newLabelID;
  for (auto riter = callee.getBBs().rbegin(); riter != callee.getBBs().rend();
       ++riter) {
    const auto &bb = *riter;
    auto &curBB = *caller.insertBBAfter(bbIter);
    curBB.getMutableInsts() = bb.getInsts();
    newLabelID[bb.getLabelID()] = curBB.getLabelID();
  }
  bbIter->appendInst(std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
      newLabelID.at(callee.getFirstBB()->getLabelID()))));

  // rename identifiers & LabelID; move alloca's to the first block
  std::unordered_map<std::string, std::string> newIdent;
  auto insertedBeg = bbIter;
  ++insertedBeg;
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    for (auto &inst : bb.getMutableInsts()) {
      assert(!ir::dyc<ir::Phi>(inst));
      if (auto dest = ir::dycLocalReg(ir::getDest(inst))) {
        auto newDest = caller.makeTempLocalReg(dest->getIdentifier());
        inst = ir::copyWithReplacedDest(inst, newDest);
        newIdent[dest->getIdentifier()] = newDest->getIdentifier();
      }

      auto operands = ir::getOperandsUsed(inst);
      for (auto &operand : operands) {
        auto reg = ir::dycLocalReg(operand);
        if (!reg)
          continue;
        if (isParameter(callee, reg->getIdentifier())) {
          auto n = std::stol(reg->getIdentifier(), nullptr);
          operand = call->getArgs().at((std::size_t)n);
          continue;
        }
        operand = std::make_shared<ir::Reg>(newIdent.at(reg->getIdentifier()));
      }
      inst = ir::copyWithReplacedOperands(inst, operands);

      if (auto br = ir::dyc<ir::Branch>(inst)) {
        inst = std::make_shared<ir::Branch>(
            br->getCondition(),
            std::make_shared<ir::Label>(newLabelID.at(br->getThen()->getID())),
            std::make_shared<ir::Label>(newLabelID.at(br->getElse()->getID())));
      } else if (auto jump = ir::dyc<ir::Jump>(inst)) {
        inst = std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
            newLabelID.at(jump->getLabel()->getID())));
      }

      if (auto alloca = ir::dyc<ir::Alloca>(inst)) {
        caller.getFirstBB()->getMutableInsts().push_front(std::move(inst));
        inst = std::make_shared<ir::Deleted>();
      }
    }
  }

  // rewrite Ret's
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    auto ret = ir::dyc<ir::Ret>(bb.getMutableInsts().back());
    if (!ret)
      continue;
    bb.getMutableInsts().pop_back();
    if (call->getDest()) {
      bb.appendInst(std::make_shared<ir::Store>(
          retVal,
          ret->getVal() ? ret->getVal() : std::make_shared<ir::IntLiteral>(0)));
    }
    bb.appendInst(std::make_shared<ir::Jump>(
        std::make_shared<ir::Label>(succBBIter->getLabelID())));
  }

  return succBBIter;
}